

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O2

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_false>::~VmBase
          (VmBase<defyx::AlignedAllocator<64UL>,_false> *this)

{
  (this->super_defyx_vm)._vptr_defyx_vm = (_func_int **)&PTR__VmBase_00135c50;
  AlignedAllocator<64UL>::freeMemory((this->super_defyx_vm).scratchpad,0x40000);
  defyx_vm::~defyx_vm(&this->super_defyx_vm);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}